

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O1

_Bool translateOperand(MCInst *mcInst,OperandSpecifier *operand,InternalInstruction *insn)

{
  uint8_t uVar1;
  _Bool _Var2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined *puVar7;
  uint8_t *puVar8;
  uint uVar9;
  bool bVar10;
  
LAB_001a488d:
  switch(operand->encoding) {
  case '\x01':
    uVar5 = (ulong)insn->reg;
LAB_001a498f:
    puVar8 = &DAT_001f35e0;
LAB_001a4bc7:
    uVar9 = (uint)puVar8[uVar5];
LAB_001a4bce:
    MCOperand_CreateReg0(mcInst,uVar9);
    return false;
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
  case '\x06':
  case '\a':
  case '\b':
    _Var2 = translateRM(mcInst,operand,insn);
    return _Var2;
  case '\t':
    uVar5 = (ulong)insn->vvvv;
    goto LAB_001a498f;
  case '\n':
    bVar10 = (insn->writemask & (MODRM_REG_DR6|MODRM_REG_RSP)) != MODRM_REG_AL;
    if (!bVar10) {
      MCOperand_CreateReg0(mcInst,insn->writemask + MODRM_REG_XMM6 & 0x5f);
      return bVar10;
    }
    return bVar10;
  default:
    return true;
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x14':
  case '\x1a':
  case '\x1b':
    bVar3 = insn->numImmediatesTranslated;
    insn->numImmediatesTranslated = bVar3 + 1;
    uVar5 = insn->immediates[bVar3];
    bVar3 = operand->type;
    if (bVar3 < 0x10) {
      if (bVar3 - 0xc < 4) {
LAB_001a4913:
        uVar9 = MCInst_getOpcode(mcInst);
        uVar1 = operand->encoding;
        if (uVar1 == '\x13') goto LAB_001a49f1;
        if (uVar1 == '\x12') {
LAB_001a49e2:
          uVar6 = uVar5 | 0xffffffffffff0000;
          bVar10 = (short)uVar5 < 0;
          goto LAB_001a4a01;
        }
        if ((uVar1 == '\x11') && ((uVar9 & 0xfffffffb) - 0xbe3 < 0xfffffffe)) {
          if ((int)uVar9 < 0x79d) {
            if ((int)uVar9 < 0x2da) {
              if (((uVar9 != 0xfc) && (uVar9 != 0xfe)) && (uVar9 != 0x2d8)) goto LAB_001a49d4;
            }
            else if ((int)uVar9 < 0x395) {
              if ((uVar9 != 0x2da) && (uVar9 != 0x390)) goto LAB_001a49d4;
            }
            else if ((uVar9 != 0x395) && (uVar9 != 0x6df)) goto LAB_001a49d4;
          }
          else if ((int)uVar9 < 0xf1b) {
            if ((2 < uVar9 - 0xcf9) && (uVar9 != 0x79d)) {
LAB_001a49d4:
              uVar6 = uVar5 | 0xffffffffffffff00;
              bVar10 = (char)uVar5 < '\0';
              goto LAB_001a4a01;
            }
          }
          else if (((uVar9 != 0xf1b) && (uVar9 != 0x1181)) && (uVar9 != 0x1268)) goto LAB_001a49d4;
        }
      }
      else {
LAB_001a4ae8:
        if ((0x1f < uVar5) && (bVar3 == 0x11)) {
          uVar4 = MCInst_getOpcode(mcInst);
          uVar4 = uVar4 - 0xc01;
          uVar9 = 0;
          if (uVar4 < 0x29) {
            puVar7 = &DAT_001f2bd4;
LAB_001a4b11:
            uVar9 = *(uint *)(puVar7 + (ulong)uVar4 * 4);
          }
LAB_001a4b14:
          MCInst_setOpcode(mcInst,uVar9);
        }
      }
    }
    else if (bVar3 == 0x10) {
      if (7 < uVar5) {
        uVar4 = MCInst_getOpcode(mcInst);
        uVar4 = uVar4 - 0x226;
        uVar9 = 0;
        if (uVar4 < 0x12) {
          puVar7 = &DAT_001f2b8c;
          goto LAB_001a4b11;
        }
        goto LAB_001a4b14;
      }
    }
    else {
      if (bVar3 == 0x4f) goto LAB_001a4913;
      if (bVar3 != 0x50) goto LAB_001a4ae8;
      uVar1 = insn->displacementSize;
      if (uVar1 != '\x04') {
        if (uVar1 != '\x02') {
          if (uVar1 != '\x01') goto LAB_001a4b1c;
          goto LAB_001a49d4;
        }
        goto LAB_001a49e2;
      }
LAB_001a49f1:
      uVar6 = uVar5 | 0xffffffff00000000;
      bVar10 = (int)uVar5 < 0;
LAB_001a4a01:
      if (bVar10) {
        uVar5 = uVar6;
      }
    }
LAB_001a4b1c:
    uVar9 = (uint)uVar5;
    if (bVar3 < 0x3d) {
      if (bVar3 - 3 < 2) {
        uVar6 = uVar5 | 0xffffffff00000000;
        bVar10 = (int)uVar9 < 0;
      }
      else {
        if (bVar3 != 1) goto LAB_001a4b7f;
        uVar6 = uVar5 | 0xffffffffffffff00;
        bVar10 = (char)uVar5 < '\0';
      }
      if (bVar10) {
        uVar5 = uVar6;
      }
    }
    else {
      if (bVar3 - 0x3d < 3) {
        uVar9 = ((uint)(uVar5 >> 4) & 0xfffffff) + 0x72;
        goto LAB_001a4bce;
      }
      if (bVar3 == 0x40) {
        uVar9 = (uVar9 >> 4) + 0x92;
        goto LAB_001a4bce;
      }
      if (bVar3 == 0x41) {
        uVar9 = (uVar9 >> 4) + 0xb2;
        goto LAB_001a4bce;
      }
    }
LAB_001a4b7f:
    MCOperand_CreateImm0(mcInst,uVar5);
    if (3 < (byte)(bVar3 - 0x2d)) {
      return false;
    }
    break;
  case '\x15':
  case '\x16':
  case '\x17':
  case '\x18':
  case '\x1c':
    uVar5 = (ulong)insn->opcodeRegister;
    goto LAB_001a498f;
  case '\x19':
    uVar9 = (insn->modRM & 7) + 0x6a;
    goto LAB_001a4bce;
  case '\x1d':
    goto switchD_001a48a4_caseD_1d;
  case '\x1e':
    bVar3 = insn->isPrefix67;
    if (insn->mode == MODE_32BIT) {
LAB_001a4bab:
      uVar9 = (uint)bVar3 * 0x10 + 0x1d;
    }
    else {
      if (insn->mode != MODE_64BIT) {
        bVar3 = bVar3 ^ 1;
        goto LAB_001a4bab;
      }
      uVar9 = 0x2b;
      if ((_Bool)bVar3 != false) {
        uVar9 = 0x1d;
      }
    }
    MCOperand_CreateReg0(mcInst,uVar9);
    break;
  case '\x1f':
    bVar3 = insn->isPrefix67;
    if (insn->mode == MODE_32BIT) {
      bVar3 = bVar3 ^ 1;
    }
    else if (insn->mode == MODE_64BIT) {
      uVar9 = (uint)(bVar3 ^ 1) * 0x10 + 0x17;
      goto LAB_001a4bce;
    }
    uVar9 = (uint)bVar3 + (uint)bVar3 * 8 + 0xe;
    goto LAB_001a4bce;
  }
  uVar5 = (ulong)insn->segmentOverride;
  puVar8 = "";
  goto LAB_001a4bc7;
switchD_001a48a4_caseD_1d:
  operand = insn->operands + ((ulong)operand->type - 0x51);
  goto LAB_001a488d;
}

Assistant:

static bool translateOperand(MCInst *mcInst, const OperandSpecifier *operand, InternalInstruction *insn)
{
	switch (operand->encoding) {
		case ENCODING_REG:
			translateRegister(mcInst, insn->reg);
			return false;
		case ENCODING_WRITEMASK:
			return translateMaskRegister(mcInst, insn->writemask);
		CASE_ENCODING_RM:
			return translateRM(mcInst, operand, insn);
		case ENCODING_CB:
		case ENCODING_CW:
		case ENCODING_CD:
		case ENCODING_CP:
		case ENCODING_CO:
		case ENCODING_CT:
			//debug("Translation of code offsets isn't supported.");
			return true;
		case ENCODING_IB:
		case ENCODING_IW:
		case ENCODING_ID:
		case ENCODING_IO:
		case ENCODING_Iv:
		case ENCODING_Ia:
			translateImmediate(mcInst, insn->immediates[insn->numImmediatesTranslated++], operand, insn);
			return false;
		case ENCODING_SI:
			return translateSrcIndex(mcInst, insn);
		case ENCODING_DI:
			return translateDstIndex(mcInst, insn);
		case ENCODING_RB:
		case ENCODING_RW:
		case ENCODING_RD:
		case ENCODING_RO:
		case ENCODING_Rv:
			translateRegister(mcInst, insn->opcodeRegister);
			return false;
		case ENCODING_FP:
			translateFPRegister(mcInst, insn->modRM & 7);
			return false;
		case ENCODING_VVVV:
			translateRegister(mcInst, insn->vvvv);
			return false;
		case ENCODING_DUP:
			return translateOperand(mcInst, &insn->operands[operand->type - TYPE_DUP0], insn);
		default:
			//debug("Unhandled operand encoding during translation");
			return true;
	}
}